

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
Catch::Detail::makeEnumInfo
          (StringRef enumName,StringRef allValueNames,vector<int,_std::allocator<int>_> *values)

{
  int *piVar1;
  size_type *psVar2;
  pointer *__ptr;
  __uniq_ptr_data<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>,_true,_true>
  _Var3;
  long *in_R9;
  long lVar4;
  const_iterator __begin2;
  int *piVar5;
  StringRef enums;
  int value;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> valueNames;
  int local_4c;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_48;
  
  _Var3.
  super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>._M_t
  .super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>.
  super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl =
       (__uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>)
       enumName.m_start;
  psVar2 = (size_type *)operator_new(0x28);
  *psVar2 = (size_type)"";
  psVar2[1] = 0;
  psVar2[2] = 0;
  psVar2[3] = 0;
  psVar2[4] = 0;
  *(size_type **)
   _Var3.
   super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>.
   _M_t.
   super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>.
   super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl = psVar2;
  *psVar2 = enumName.m_size;
  psVar2[1] = (size_type)allValueNames.m_start;
  clara::std::
  vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>::
  reserve((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
           *)(psVar2 + 2),in_R9[1] - *in_R9 >> 2);
  enums.m_size = (size_type)values;
  enums.m_start = (char *)allValueNames.m_size;
  parseEnums(&local_48,enums);
  piVar5 = (int *)*in_R9;
  piVar1 = (int *)in_R9[1];
  if ((long)local_48.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_48.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
            .super__Vector_impl_data._M_start >> 4 == (long)piVar1 - (long)piVar5 >> 2) {
    if (piVar5 != piVar1) {
      lVar4 = 0;
      do {
        local_4c = *piVar5;
        std::vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>
        ::emplace_back<int&,Catch::StringRef_const&>
                  ((vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>
                    *)(*(long *)_Var3.
                                super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
                                .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>.
                                _M_head_impl + 0x10),&local_4c,
                   (StringRef *)
                   ((long)&(local_48.
                            super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_start)->m_start + lVar4));
        piVar5 = piVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (piVar5 != piVar1);
    }
    if (local_48.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return (__uniq_ptr_data<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>,_true,_true>
            )(tuple<Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>)
             _Var3.
             super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
             .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl;
  }
  __assert_fail("valueNames.size() == values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/dependencies/Catch2/single_include/catch2/catch.hpp"
                ,0x2986,
                "std::unique_ptr<EnumInfo> Catch::Detail::makeEnumInfo(StringRef, StringRef, const std::vector<int> &)"
               );
}

Assistant:

std::unique_ptr<EnumInfo> makeEnumInfo( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            std::unique_ptr<EnumInfo> enumInfo( new EnumInfo );
            enumInfo->m_name = enumName;
            enumInfo->m_values.reserve( values.size() );

            const auto valueNames = Catch::Detail::parseEnums( allValueNames );
            assert( valueNames.size() == values.size() );
            std::size_t i = 0;
            for( auto value : values )
                enumInfo->m_values.emplace_back(value, valueNames[i++]);

            return enumInfo;
        }